

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

Ivy_Store_t * Ivy_NodeFindCutsAll(Ivy_Man_t *p,Ivy_Obj_t *pObj,int nLeaves)

{
  int iVar1;
  int Id1;
  int iVar2;
  Ivy_Cut_t *pCut_00;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  int iLeaf1;
  int iLeaf0;
  int k;
  int i;
  Ivy_Obj_t *pLeaf;
  Ivy_Cut_t *pCut;
  Ivy_Cut_t *pCutNew;
  Ivy_Cut_t CutNew;
  int nLeaves_local;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  CutNew.pArray[5] = nLeaves;
  unique0x10000299 = pObj;
  if (6 < nLeaves) {
    __assert_fail("nLeaves <= IVY_CUT_INPUT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,899,"Ivy_Store_t *Ivy_NodeFindCutsAll(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  Ivy_NodeFindCutsAll::pCutStore->nCuts = 0;
  Ivy_NodeFindCutsAll::pCutStore->nCutsMax = 0x100;
  CutNew.pArray[4] = 0;
  pCutNew._4_2_ = 1;
  pCutNew._6_2_ = (undefined2)nLeaves;
  CutNew.nLatches = pObj->Id;
  Ivy_NodeCutHash((Ivy_Cut_t *)&pCutNew);
  Ivy_NodeCutFindOrAdd(Ivy_NodeFindCutsAll::pCutStore,(Ivy_Cut_t *)&pCutNew);
  if (Ivy_NodeFindCutsAll::pCutStore->nCuts != 1) {
    __assert_fail("pCutStore->nCuts == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyCut.c"
                  ,0x390,"Ivy_Store_t *Ivy_NodeFindCutsAll(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  for (iLeaf0 = 0; iLeaf0 < Ivy_NodeFindCutsAll::pCutStore->nCuts; iLeaf0 = iLeaf0 + 1) {
    pCut_00 = Ivy_NodeFindCutsAll::pCutStore->pCuts + iLeaf0;
    if (pCut_00->nSize != 0) {
      for (iLeaf1 = 0; iLeaf1 < pCut_00->nSize; iLeaf1 = iLeaf1 + 1) {
        pIVar3 = Ivy_ManObj(p,pCut_00->pArray[iLeaf1]);
        iVar1 = Ivy_ObjIsCi(pIVar3);
        if (iVar1 == 0) {
          pIVar4 = Ivy_ObjFanin0(pIVar3);
          pIVar4 = Ivy_ObjRealFanin(pIVar4);
          iVar1 = Ivy_ObjId(pIVar4);
          pIVar3 = Ivy_ObjFanin1(pIVar3);
          pIVar3 = Ivy_ObjRealFanin(pIVar3);
          Id1 = Ivy_ObjId(pIVar3);
          iVar2 = Ivy_NodeCutPrescreen(pCut_00,iVar1,Id1);
          if (iVar2 != 0) {
            if (Id1 < iVar1) {
              Ivy_NodeCutDeriveNew(pCut_00,(Ivy_Cut_t *)&pCutNew,pCut_00->pArray[iLeaf1],Id1,iVar1);
            }
            else {
              Ivy_NodeCutDeriveNew(pCut_00,(Ivy_Cut_t *)&pCutNew,pCut_00->pArray[iLeaf1],iVar1,Id1);
            }
            Ivy_NodeCutFindOrAddFilter(Ivy_NodeFindCutsAll::pCutStore,(Ivy_Cut_t *)&pCutNew);
            if (Ivy_NodeFindCutsAll::pCutStore->nCuts == 0x100) break;
          }
        }
      }
      if (Ivy_NodeFindCutsAll::pCutStore->nCuts == 0x100) break;
    }
  }
  Ivy_NodeCompactCuts(Ivy_NodeFindCutsAll::pCutStore);
  return Ivy_NodeFindCutsAll::pCutStore;
}

Assistant:

Ivy_Store_t * Ivy_NodeFindCutsAll( Ivy_Man_t * p, Ivy_Obj_t * pObj, int nLeaves )
{
    static Ivy_Store_t CutStore, * pCutStore = &CutStore;
    Ivy_Cut_t CutNew, * pCutNew = &CutNew, * pCut;
    Ivy_Obj_t * pLeaf;
    int i, k, iLeaf0, iLeaf1;

    assert( nLeaves <= IVY_CUT_INPUT );

    // start the structure
    pCutStore->nCuts = 0;
    pCutStore->nCutsMax = IVY_CUT_LIMIT;
    // start the trivial cut
    pCutNew->uHash = 0;
    pCutNew->nSize = 1;
    pCutNew->nSizeMax = nLeaves;
    pCutNew->pArray[0] = pObj->Id;
    Ivy_NodeCutHash( pCutNew );
    // add the trivial cut
    Ivy_NodeCutFindOrAdd( pCutStore, pCutNew );
    assert( pCutStore->nCuts == 1 );

    // explore the cuts
    for ( i = 0; i < pCutStore->nCuts; i++ )
    {
        // expand this cut
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        for ( k = 0; k < pCut->nSize; k++ )
        {
            pLeaf = Ivy_ManObj( p, pCut->pArray[k] );
            if ( Ivy_ObjIsCi(pLeaf) )
                continue;
/*
            *pCutNew = *pCut;
            Ivy_NodeCutShrink( pCutNew, pLeaf->Id );
            if ( !Ivy_NodeCutExtend( pCutNew, Ivy_ObjFaninId0(pLeaf) ) )
                continue;
            if ( Ivy_ObjIsNode(pLeaf) && !Ivy_NodeCutExtend( pCutNew, Ivy_ObjFaninId1(pLeaf) ) )
                continue;
            Ivy_NodeCutHash( pCutNew );
*/
            iLeaf0 = Ivy_ObjId( Ivy_ObjRealFanin(Ivy_ObjFanin0(pLeaf)) );
            iLeaf1 = Ivy_ObjId( Ivy_ObjRealFanin(Ivy_ObjFanin1(pLeaf)) );
//            if ( iLeaf0 == iLeaf1 ) // strange situation observed on Jan 18, 2007
//                continue;
            if ( !Ivy_NodeCutPrescreen( pCut, iLeaf0, iLeaf1 ) )
                continue;
            if ( iLeaf0 > iLeaf1 )
                Ivy_NodeCutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf1, iLeaf0 );
            else
                Ivy_NodeCutDeriveNew( pCut, pCutNew, pCut->pArray[k], iLeaf0, iLeaf1 );
            Ivy_NodeCutFindOrAddFilter( pCutStore, pCutNew );
            if ( pCutStore->nCuts == IVY_CUT_LIMIT )
                break;
        }
        if ( pCutStore->nCuts == IVY_CUT_LIMIT )
            break;
    }
    Ivy_NodeCompactCuts( pCutStore );
//    Ivy_NodePrintCuts( pCutStore );
    return pCutStore;
}